

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

int run_test_metrics_pool_events(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_9;
  int64_t eval_b_11;
  char rdata;
  uv_metrics_t metrics;
  uv_getaddrinfo_t addrinfo_req;
  uv_buf_t local_9c8;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_random_t random_req;
  uv_fs_t open_req;
  uv_prepare_t prepare;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_configure(puVar2,UV_METRICS_IDLE_TIME);
  open_req.data = (void *)(long)iVar1;
  stat1_req.data = (void *)0x0;
  if (open_req.data == (void *)0x0) {
    uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file",(uv_fs_cb)0x0);
    uv_fs_req_cleanup(&unlink_req);
    puVar2 = uv_default_loop();
    iVar1 = uv_prepare_init(puVar2,&prepare);
    open_req.data = (void *)(long)iVar1;
    stat1_req.data = (void *)0x0;
    if (open_req.data == (void *)0x0) {
      iVar1 = uv_prepare_start(&prepare,fs_prepare_cb);
      open_req.data = (void *)(long)iVar1;
      stat1_req.data = (void *)0x0;
      if (open_req.data == (void *)0x0) {
        pool_events_counter = 0;
        iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req,"test_file",0x41,0x180,(uv_fs_cb)0x0);
        stat1_req.data = (void *)(long)iVar1;
        if (stat1_req.data == (void *)0x0) {
          stat1_req.data = (void *)open_req.result;
          stat2_req.data = (void *)0x0;
          if (open_req.result < 0) {
            pcVar5 = ">=";
            pcVar4 = "open_req.result";
            uVar3 = 0x151;
          }
          else {
            uv_fs_req_cleanup(&open_req);
            local_9c8 = uv_buf_init(test_buf,0xd);
            puVar2 = uv_default_loop();
            iVar1 = uv_fs_write(puVar2,&write_req,(uv_os_fd_t)open_req.result,&local_9c8,1,0,
                                fs_write_cb);
            stat1_req.data = (void *)(long)iVar1;
            stat2_req.data = (void *)0x0;
            if (stat1_req.data == (void *)0x0) {
              puVar2 = uv_default_loop();
              iVar1 = uv_fs_stat(puVar2,&stat1_req,"test_file",fs_stat_cb);
              eval_b_9 = (int64_t)iVar1;
              addrinfo_req.data = (void *)0x0;
              stat2_req.data = (void *)eval_b_9;
              if ((void *)eval_b_9 == (void *)0x0) {
                puVar2 = uv_default_loop();
                iVar1 = uv_fs_stat(puVar2,&stat2_req,"test_file",fs_stat_cb);
                addrinfo_req.data = (void *)(long)iVar1;
                random_req.data = (void *)0x0;
                if (addrinfo_req.data == (void *)0x0) {
                  puVar2 = uv_default_loop();
                  iVar1 = uv_random(puVar2,&random_req,&rdata,1,0,fs_random_cb);
                  addrinfo_req.data = (void *)(long)iVar1;
                  metrics.loop_count = 0;
                  if (addrinfo_req.data == (void *)0x0) {
                    puVar2 = uv_default_loop();
                    iVar1 = uv_getaddrinfo(puVar2,&addrinfo_req,fs_addrinfo_cb,"example.invalid",
                                           (char *)0x0,(addrinfo *)0x0);
                    metrics.loop_count = (uint64_t)iVar1;
                    if (metrics.loop_count == 0) {
                      uv_sleep(100);
                      puVar2 = uv_default_loop();
                      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                      metrics.loop_count = (uint64_t)iVar1;
                      if (metrics.loop_count == 0) {
                        puVar2 = uv_default_loop();
                        iVar1 = uv_metrics_info(puVar2,&metrics);
                        eval_b_9 = (int64_t)iVar1;
                        eval_b_11 = 0;
                        if ((void *)eval_b_9 == (void *)0x0) {
                          eval_b_11 = 7;
                          if ((long)metrics.events < 7) {
                            pcVar5 = ">=";
                            pcVar6 = "7";
                            pcVar4 = "metrics.events";
                            uVar3 = 0x17c;
                            eval_b_9 = metrics.events;
                          }
                          else {
                            eval_b_11 = 4;
                            if ((long)metrics.events_waiting < 4) {
                              pcVar5 = ">=";
                              pcVar6 = "4";
                              pcVar4 = "metrics.events_waiting";
                              uVar3 = 0x181;
                              eval_b_9 = metrics.events_waiting;
                            }
                            else {
                              eval_b_9 = (int64_t)pool_events_counter;
                              eval_b_11 = -0x2a;
                              if ((void *)eval_b_9 == (void *)0xffffffffffffffd6) {
                                uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file",(uv_fs_cb)0x0)
                                ;
                                uv_fs_req_cleanup(&unlink_req);
                                puVar2 = uv_default_loop();
                                close_loop(puVar2);
                                eval_b_9 = 0;
                                puVar2 = uv_default_loop();
                                iVar1 = uv_loop_close(puVar2);
                                eval_b_11 = (int64_t)iVar1;
                                if (eval_b_11 == 0) {
                                  uv_library_shutdown();
                                  return 0;
                                }
                                pcVar5 = "==";
                                pcVar6 = "uv_loop_close(uv_default_loop())";
                                pcVar4 = "0";
                                uVar3 = 0x187;
                              }
                              else {
                                pcVar5 = "==";
                                pcVar6 = "-42";
                                pcVar4 = "pool_events_counter";
                                uVar3 = 0x182;
                              }
                            }
                          }
                        }
                        else {
                          pcVar5 = "==";
                          pcVar6 = "0";
                          pcVar4 = "uv_metrics_info(uv_default_loop(), &metrics)";
                          uVar3 = 0x178;
                        }
                        goto LAB_001571fb;
                      }
                      pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                      uVar3 = 0x176;
                    }
                    else {
                      pcVar4 = 
                      "uv_getaddrinfo(uv_default_loop(), &addrinfo_req, fs_addrinfo_cb, \"example.invalid\", ((void*)0), ((void*)0))"
                      ;
                      uVar3 = 0x170;
                    }
                    pcVar6 = "0";
                    eval_b_11 = 0;
                    pcVar5 = "==";
                    eval_b_9 = metrics.loop_count;
                    goto LAB_001571fb;
                  }
                  pcVar4 = "uv_random(uv_default_loop(), &random_req, &rdata, 1, 0, fs_random_cb)";
                  uVar3 = 0x16a;
                }
                else {
                  pcVar4 = "uv_fs_stat(uv_default_loop(), &stat2_req, \"test_file\", fs_stat_cb)";
                  uVar3 = 0x164;
                }
                eval_b_11 = 0;
                pcVar6 = "0";
                pcVar5 = "==";
                eval_b_9 = (int64_t)addrinfo_req.data;
              }
              else {
                pcVar6 = "0";
                pcVar4 = "uv_fs_stat(uv_default_loop(), &stat1_req, \"test_file\", fs_stat_cb)";
                uVar3 = 0x160;
                eval_b_11 = 0;
                pcVar5 = "==";
              }
              goto LAB_001571fb;
            }
            pcVar5 = "==";
            pcVar4 = "uv_fs_write(uv_default_loop(), &write_req, fd, &iov, 1, 0, fs_write_cb)";
            uVar3 = 0x15c;
          }
        }
        else {
          pcVar5 = "==";
          pcVar4 = "r";
          uVar3 = 0x150;
        }
        stat2_req.data = (void *)0x0;
        pcVar6 = "0";
        eval_b_11 = 0;
        eval_b_9 = (int64_t)stat1_req.data;
        goto LAB_001571fb;
      }
      pcVar4 = "uv_prepare_start(&prepare, fs_prepare_cb)";
      uVar3 = 0x149;
    }
    else {
      pcVar4 = "uv_prepare_init(uv_default_loop(), &prepare)";
      uVar3 = 0x148;
    }
  }
  else {
    pcVar4 = "uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME)";
    uVar3 = 0x143;
  }
  stat1_req.data = (void *)0x0;
  pcVar6 = "0";
  eval_b_11 = 0;
  pcVar5 = "==";
  eval_b_9 = (int64_t)open_req.data;
LAB_001571fb:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_b_9,pcVar5,eval_b_11);
  abort();
}

Assistant:

TEST_IMPL(metrics_pool_events) {
  uv_buf_t iov;
  uv_fs_t open_req;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  uv_getaddrinfo_t addrinfo_req;
  uv_metrics_t metrics;
  uv_prepare_t prepare;
  uv_random_t random_req;
  uv_os_fd_t fd;
  int r;
  char rdata;

  ASSERT_OK(uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME));

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare));
  ASSERT_OK(uv_prepare_start(&prepare, fs_prepare_cb));

  pool_events_counter = 0;
  r = uv_fs_open(NULL,
                  &open_req, "test_file", UV_FS_O_WRONLY | UV_FS_O_CREAT,
                  S_IRUSR | S_IWUSR,
                  NULL);
  ASSERT_EQ(r, 0);
  ASSERT_GE(open_req.result, 0);
  fd = (uv_os_fd_t) open_req.result;
  uv_fs_req_cleanup(&open_req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &write_req,
                        fd,
                        &iov,
                        1,
                        0,
                        fs_write_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat1_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat2_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_random(uv_default_loop(),
                      &random_req,
                      &rdata,
                      1,
                      0,
                      fs_random_cb));
  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &addrinfo_req,
                           fs_addrinfo_cb,
                           "example.invalid",
                           NULL,
                           NULL));

  /* Sleep for a moment to hopefully force the events to complete before
   * entering the event loop. */
  uv_sleep(100);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* It's possible for uv__work_done() to execute one extra time even though the
   * QUEUE has already been cleared out. This has to do with the way we use an
   * uv_async to tell the event loop thread to process the worker pool QUEUE. */
  ASSERT_GE(metrics.events, 7);
  /* It's possible one of the other events also got stuck in the event queue, so
   * check GE instead of EQ. Reason for 4 instead of 5 is because the call to
   * uv_getaddrinfo() is racey and slow. So can't guarantee that it'll always
   * execute before sleep completes. */
  ASSERT_GE(metrics.events_waiting, 4);
  ASSERT_EQ(pool_events_counter, -42);

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}